

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_local.c
# Opt level: O2

int localSync(mpt_output *out,int timeout)

{
  int iVar1;
  mpt_output *pmVar2;
  
  pmVar2 = localPassOutput((mpt_local_output *)(out + -2));
  if (pmVar2 != (mpt_output *)0x0) {
    iVar1 = (*pmVar2->_vptr->sync)(pmVar2,timeout);
    return iVar1;
  }
  return -4;
}

Assistant:

static int localSync(MPT_INTERFACE(output) *out, int timeout)
{
	if (!(out = localPassOutput(MPT_baseaddr(local_output, out, _out)))) {
		return MPT_ERROR(BadOperation);
	}
	return out->_vptr->sync(out, timeout);
}